

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O2

int main(void)

{
  timespec end;
  timespec start;
  
  clock_gettime(1,(timespec *)&start);
  str = "";
  p = "";
  clock_gettime(1,(timespec *)&end);
  printf("%s, empty:\n\t %lld\n","main",
         ((end.tv_sec - start.tv_sec) * 1000000000 + end.tv_nsec) - start.tv_nsec);
  clock_gettime(1,(timespec *)&start);
  str = "aldasdklfa;";
  clock_gettime(1,(timespec *)&end);
  printf("%s, str1:\n\t %lld\n","main",
         ((end.tv_sec - start.tv_sec) * 1000000000 + end.tv_nsec) - start.tv_nsec);
  clock_gettime(1,(timespec *)&start);
  str = 
  "ajlka;sdka;lsak;jfalskdj;ldasdklfa;aldasdklfa;ajlka;sdka;lsak;jfalskdj;ldasdklfa;aldasdklfa;ajlka;sdka;lsak;jfalskdj;ldasdklfa;aldasdklfa;ajlka;sdka;lsak;jfalskdj;ldasdklfa;aldasdklfa;ajlka;sdka;lsak;jfalskdj;ldasdklfa;aldasdklfa;ajlka;sdka;lsak;jfalskdj;ldasdklfa;aldasdklfa;"
  ;
  clock_gettime(1,(timespec *)&end);
  printf("%s, str2:\n\t %lld\n","main",
         ((end.tv_sec - start.tv_sec) * 1000000000 + end.tv_nsec) - start.tv_nsec);
  clock_gettime(1,(timespec *)&start);
  str = 
  "ajlka;sdka;lsak;jfalskdj;ldasdklfa;aldasdklfa;ajlka;sdka;lsak;jfalskdj;ldasdklfa;aldasdklfa;ajlka;sdka;lsak;jfalskdj;ldasdklfa;aldasdklfa;ajlka;sdka;lsak;jfalskdj;ldasdklfa;aldasdklfa;ajlka;sdka;lsak;jfalskdj;ldasdklfa;aldasdklfa;ajlka;sdka;lsak;jfalskdj;ldasdklfa;aldasdklfa;ajlka;sdka;lsak;jfalskdj;ldasdklfa;aldasdklfa;ajlka;sdka;lsak;jfalskdj;ldasdklfa;aldasdklfa;ajlka;sdka;lsak;jfalskdj;ldasdklfa;aldasdklfa;ajlka;sdka;lsak;jfalskdj;ldasdklfa;aldasdklfa;ajlka;sdka;lsak;jfalskdj;ldasdklfa;aldasdklfa;ajlka;sdka;lsak;jfalskdj;ldasdklfa;aldasdklfa;ajlka;sdka;lsak;jfalskdj;ldasdklfa;aldasdklfa;ajlka;sdka;lsak;jfalskdj;ldasdklfa;aldasdklfa;ajlka;sdka;lsak;jfalskdj;ldasdklfa;aldasdklfa;ajlka;sdka;lsak;jfalskdj;ldasdklfa;aldasdklfa;ajlka;sdka;lsak;jfalskdj;ldasdklfa;aldasdklfa;ajlka;sdka;lsak;jfalskdj;ldasdklfa;aldasdklfa;ajlka;sdka;lsak;jfalskdj;ldasdklfa;aldasdklfa;ajlka;sdka;lsak;jfalskdj;ldasdklfa;aldasdklfa;ajlka;sdka;lsak;jfalskdj;ldasdklfa;aldasdklfa;ajlka;sdka;lsak;jfalskdj;ldasdklfa;aldasdklfa;ajlka;sdka;lsak;jfalskdj;ldasdklfa;aldasdklfa;ajlka;sdka;lsak;jfalskdj;ldasdklfa;aldasdklfa;ajlka;sdka;lsak;jfalskdj;ldasdklfa;aldasdklfa;ajlka;sdka;lsak;jfalskdj;ldasdklfa;aldasdklfa;ajlka;sdka;lsak;jfalskdj;ldasdklfa;aldasdklfa;ajlka;sdka;lsak;jfalskdj;ldasdklfa;aldasdklfa;ajlka;sdka;lsak;jfalskdj;ldasdklfa;aldasdklfa;ajlka;sdka;lsak;jfalskdj;ldasdklfa;aldasdklfa;ajlka;sdka;lsak;jfalskdj;ldasdklfa;aldasdklfa;ajlka;sdka;lsak;jfalskdj;ldasdklfa;aldasdklfa;ajlka;sdka;lsak;jfalskdj;ldasdklfa;aldasdklfa;ajlka;sdka;lsak;jfalskdj;ldasdklfa;aldasdklfa;ajlka;sdka;lsak;jfalskdj;ldasdklfa;aldasdklfa;ajlka;sdka;lsak;jfalskdj;ldasdklfa;aldasdklfa;ajlka;sdka;lsak;jfalskdj;ldasdklfa;aldasdklfa;ajlka;sdka;lsak;jfalskdj;ldasdklfa;aldasdklfa;ajlka;sdka;lsak;jfalskdj;ldasdklfa;aldasdklfa;ajlka;sdka;lsak;jfalskdj;ldasdklfa;aldasdklfa;ajlka;sdka;lsak;jfalskdj;ldasdklfa;aldasdklfa;ajlka;sdka;lsak;jfalskdj;ldasdklfa;aldasdklfa;ajlka;sdka;lsak;jfalskdj;ldasdklfa;aldasdklfa;ajlka;sdka;lsak;jfalskdj;ldasdklfa;aldasdklfa;ajlka;sdka;lsak;jfalskdj..." /* TRUNCATED STRING LITERAL */
  ;
  clock_gettime(1,(timespec *)&end);
  printf("%s, str3:\n\t %lld\n","main",
         ((end.tv_sec - start.tv_sec) * 1000000000 + end.tv_nsec) - start.tv_nsec);
  return 0;
}

Assistant:

int
main()
{
    unsigned int i;
    struct timespec start, end;
    long long t;

    clock_gettime(CLOCK_ID, &start);
    str = "";
    for (i = 0;i < N;i++) {
        if (strlen(str) == 0) {
            p = "";
        }
    }
    clock_gettime(CLOCK_ID, &end);
    t = ((end.tv_sec - start.tv_sec) * 1000000000)
        + end.tv_nsec - start.tv_nsec;
    printf("%s, empty:\n\t %lld\n", __func__, t);

    clock_gettime(CLOCK_ID, &start);
    str = STR1;
    for (i = 0;i < N;i++) {
        if (strlen(str) == 0) {
            p = "";
        }
    }
    clock_gettime(CLOCK_ID, &end);
    t = ((end.tv_sec - start.tv_sec) * 1000000000)
        + end.tv_nsec - start.tv_nsec;
    printf("%s, str1:\n\t %lld\n", __func__, t);

    clock_gettime(CLOCK_ID, &start);
    str = STR2;
    for (i = 0;i < N;i++) {
        if (strlen(str) == 0) {
            p = "";
        }
    }
    clock_gettime(CLOCK_ID, &end);
    t = ((end.tv_sec - start.tv_sec) * 1000000000)
        + end.tv_nsec - start.tv_nsec;
    printf("%s, str2:\n\t %lld\n", __func__, t);

    clock_gettime(CLOCK_ID, &start);
    str = STR3;
    for (i = 0;i < N;i++) {
        if (strlen(str) == 0) {
            p = "";
        }
    }
    clock_gettime(CLOCK_ID, &end);
    t = ((end.tv_sec - start.tv_sec) * 1000000000)
        + end.tv_nsec - start.tv_nsec;
    printf("%s, str3:\n\t %lld\n", __func__, t);
    return 0;
}